

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_buffer.c
# Opt level: O0

void csp_buffer_refc_inc(void *buffer)

{
  int *piVar1;
  csp_skbf_t *buf;
  void *buffer_local;
  
  if (buffer == (void *)0x0) {
    csp_dbg_errno = '\v';
  }
  else {
    piVar1 = (int *)((long)buffer + -0x10);
    if (*(int **)((long)buffer + -8) == piVar1) {
      *piVar1 = *piVar1 + 1;
    }
    else {
      csp_dbg_errno = '\x01';
    }
  }
  return;
}

Assistant:

void csp_buffer_refc_inc(void * buffer) {

	if (!buffer) {
		csp_dbg_errno = CSP_DBG_ERR_INVALID_POINTER;
		return;
	}

	csp_skbf_t * buf = CONTAINER_OF(buffer, csp_skbf_t, skbf_data);
	if (buf->skbf_addr != buf) {
		csp_dbg_errno = CSP_DBG_ERR_CORRUPT_BUFFER;
		return;
	}
    buf->refcount++;

}